

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void __thiscall OjaNewton::update_K(OjaNewton *this)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  long lVar4;
  int j;
  long lVar5;
  int iVar6;
  
  fVar1 = (this->data).sketch_cnt;
  fVar2 = (this->data).norm2_x;
  iVar6 = this->m;
  for (lVar4 = 1; lVar5 = 1, lVar4 <= iVar6; lVar4 = lVar4 + 1) {
    for (; lVar5 <= iVar6; lVar5 = lVar5 + 1) {
      this->K[lVar4][lVar5] =
           (this->data).delta[lVar4] * (this->data).Zx[lVar5] * (this->data).sketch_cnt +
           this->K[lVar4][lVar5];
      this->K[lVar4][lVar5] =
           (this->data).delta[lVar5] * (this->data).Zx[lVar4] * (this->data).sketch_cnt +
           this->K[lVar4][lVar5];
      pfVar3 = (this->data).delta;
      this->K[lVar4][lVar5] =
           pfVar3[lVar4] * pfVar3[lVar5] * fVar2 * fVar1 * fVar1 + this->K[lVar4][lVar5];
      iVar6 = this->m;
    }
  }
  return;
}

Assistant:

void update_K()
  {
    float tmp = data.norm2_x * data.sketch_cnt * data.sketch_cnt;
    for (int i = 1; i <= m; i++)
    {
      for (int j = 1; j <= m; j++)
      {
        K[i][j] += data.delta[i] * data.Zx[j] * data.sketch_cnt;
        K[i][j] += data.delta[j] * data.Zx[i] * data.sketch_cnt;
        K[i][j] += data.delta[i] * data.delta[j] * tmp;
      }
    }
  }